

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint * create_not_equal_to_value_constraint(intptr_t expected_value,char *expected_value_name)

{
  CgreenValue expected_value_00;
  Constraint *pCVar1;
  CgreenValue local_28;
  
  make_cgreen_integer_value(&local_28,expected_value);
  expected_value_00.value.integer_value = local_28.value.integer_value;
  expected_value_00.type = local_28.type;
  expected_value_00._4_4_ = local_28._4_4_;
  expected_value_00.value_size = local_28.value_size;
  pCVar1 = create_constraint_expecting(expected_value_00,expected_value_name);
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_do_not_want_value;
  pCVar1->execute = test_want;
  pCVar1->name = "not equal";
  pCVar1->size_of_expected_value = 8;
  return pCVar1;
}

Assistant:

Constraint *create_not_equal_to_value_constraint(intptr_t expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(expected_value), expected_value_name);
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_do_not_want_value;
    constraint->execute = &test_want;
    constraint->name = "not equal";
    constraint->size_of_expected_value = sizeof(intptr_t);

    return constraint;
}